

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImDrawDataBuilder::ClearFreeMemory(ImDrawDataBuilder *this)

{
  int local_14;
  int n;
  ImDrawDataBuilder *this_local;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    ImVector<ImDrawList_*>::clear(this->Layers + local_14);
  }
  return;
}

Assistant:

void ClearFreeMemory()  { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].clear(); }